

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

void wmap(settings_w *sesskey,char *outkey,Conf *conf,int primary,_Bool include_values)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *L;
  char *pcStack_58;
  int len;
  char *q;
  char *val;
  char *realkey;
  char *key;
  char *p;
  char *buf;
  _Bool include_values_local;
  Conf *pCStack_20;
  int primary_local;
  Conf *conf_local;
  char *outkey_local;
  settings_w *sesskey_local;
  
  L._4_4_ = 1;
  buf._3_1_ = include_values;
  buf._4_4_ = primary;
  pCStack_20 = conf;
  conf_local = (Conf *)outkey;
  outkey_local = (char *)sesskey;
  q = conf_get_str_strs(conf,primary,(char *)0x0,&realkey);
  while (q != (char *)0x0) {
    sVar2 = strlen(realkey);
    sVar3 = strlen(q);
    L._4_4_ = L._4_4_ + ((int)sVar2 + (int)sVar3) * 2 + 2;
    q = conf_get_str_strs(pCStack_20,buf._4_4_,realkey,&realkey);
  }
  key = (char *)safemalloc((long)L._4_4_,1,0);
  p = key;
  q = conf_get_str_strs(pCStack_20,buf._4_4_,(char *)0x0,&realkey);
  while (q != (char *)0x0) {
    if ((buf._4_4_ == 0xb0) && (iVar1 = strcmp(q,"D"), iVar1 == 0)) {
      val = realkey;
      q = anon_var_dwarf_2471b + 10;
      realkey = dupstr(realkey);
      pcVar4 = strchr(realkey,0x4c);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = 'D';
      }
    }
    else {
      val = (char *)0x0;
    }
    if (key != p) {
      *key = ',';
      key = key + 1;
    }
    for (pcStack_58 = realkey; *pcStack_58 != '\0'; pcStack_58 = pcStack_58 + 1) {
      if (((*pcStack_58 == '=') || (*pcStack_58 == ',')) || (*pcStack_58 == '\\')) {
        *key = '\\';
        key = key + 1;
      }
      *key = *pcStack_58;
      key = key + 1;
    }
    if ((buf._3_1_ & 1) != 0) {
      *key = '=';
      pcVar4 = key;
      for (pcStack_58 = q; key = pcVar4 + 1, *pcStack_58 != '\0'; pcStack_58 = pcStack_58 + 1) {
        if (((*pcStack_58 == '=') || (*pcStack_58 == ',')) || (*pcStack_58 == '\\')) {
          *key = '\\';
          key = pcVar4 + 2;
        }
        *key = *pcStack_58;
        pcVar4 = key;
      }
    }
    if (val != (char *)0x0) {
      free(realkey);
      realkey = val;
    }
    q = conf_get_str_strs(pCStack_20,buf._4_4_,realkey,&realkey);
  }
  *key = '\0';
  write_setting_s((settings_w *)outkey_local,(char *)conf_local,p);
  safefree(p);
  return;
}

Assistant:

static void wmap(settings_w *sesskey, char const *outkey, Conf *conf,
                 int primary, bool include_values)
{
    char *buf, *p, *key, *realkey;
    const char *val, *q;
    int len;

    len = 1;                           /* allow for NUL */

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key))
        len += 2 + 2 * (strlen(key) + strlen(val));   /* allow for escaping */

    buf = snewn(len, char);
    p = buf;

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key)) {

        if (primary == CONF_portfwd && !strcmp(val, "D")) {
            /*
             * Backwards-compatibility hack, as above: translate from
             * the sensible internal representation of dynamic
             * forwardings (key "L<port>", value "D") to the
             * conceptually incoherent legacy storage format (key
             * "D<port>", value empty).
             */
            char *L;

            realkey = key;             /* restore it at end of loop */
            val = "";
            key = dupstr(key);
            L = strchr(key, 'L');
            if (L) *L = 'D';
        } else {
            realkey = NULL;
        }

        if (p != buf)
            *p++ = ',';
        for (q = key; *q; q++) {
            if (*q == '=' || *q == ',' || *q == '\\')
                *p++ = '\\';
            *p++ = *q;
        }
        if (include_values) {
            *p++ = '=';
            for (q = val; *q; q++) {
                if (*q == '=' || *q == ',' || *q == '\\')
                    *p++ = '\\';
                *p++ = *q;
            }
        }

        if (realkey) {
            free(key);
            key = realkey;
        }
    }
    *p = '\0';
    write_setting_s(sesskey, outkey, buf);
    sfree(buf);
}